

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfilobj.cpp
# Opt level: O2

void __thiscall CVmObjFile::write_data_mode(CVmObjFile *this,vm_val_t *val)

{
  uint uVar1;
  CVmDataSource *fp;
  CVmObjPageEntry *pCVar2;
  uint16_t tmp;
  int iVar3;
  ushort *puVar4;
  ulong uStack_50;
  char buf [32];
  vm_val_t new_str;
  _func_int **pp_Var5;
  
  puVar4 = (ushort *)buf;
  fp = *(CVmDataSource **)((this->super_CVmObject).ext_ + 8);
  switch(val->typ) {
  case VM_TRUE:
    buf[0] = '\b';
    pp_Var5 = fp->_vptr_CVmDataSource;
    uStack_50 = 1;
    break;
  case VM_STACK:
  case VM_CODEPTR:
  case VM_PROP:
switchD_002760de_caseD_3:
    err_throw(0x900);
  case VM_OBJ:
    iVar3 = CVmObjBigNum::is_bignum_obj((val->val).obj);
    uVar1 = (val->val).obj;
    if (iVar3 == 0) {
      iVar3 = CVmObjByteArray::is_byte_array(uVar1);
      uVar1 = (val->val).obj;
      pCVar2 = G_obj_table_X.pages_[uVar1 >> 0xc];
      if (iVar3 == 0) {
        puVar4 = (ushort *)
                 (**(code **)(*(long *)&pCVar2[uVar1 & 0xfff].ptr_ + 0x160))
                           (pCVar2 + (uVar1 & 0xfff),uVar1,&new_str);
        goto LAB_00276106;
      }
      buf[0] = '\"';
      iVar3 = (*fp->_vptr_CVmDataSource[4])(fp,buf,1);
      if (iVar3 != 0) goto LAB_0027616c;
      iVar3 = CVmObjByteArray::write_to_data_file((CVmObjByteArray *)(pCVar2 + (uVar1 & 0xfff)),fp);
    }
    else {
      pCVar2 = G_obj_table_X.pages_[uVar1 >> 0xc];
      buf[0] = '!';
      iVar3 = (*fp->_vptr_CVmDataSource[4])(fp,buf,1);
      if (iVar3 != 0) goto LAB_0027616c;
      iVar3 = CVmObjBigNum::write_to_data_file((CVmObjBigNum *)(pCVar2 + (uVar1 & 0xfff)),fp);
    }
    goto LAB_00276168;
  case VM_INT:
    buf[0] = '\x01';
    goto LAB_00276155;
  case VM_SSTRING:
    puVar4 = (ushort *)vm_val_t::get_as_string(val);
LAB_00276106:
    buf[0] = '\x03';
    iVar3 = (*fp->_vptr_CVmDataSource[4])(fp,buf,1);
    if (iVar3 != 0) goto LAB_0027616c;
    buf[0] = (char)(*puVar4 + 2);
    buf[1] = (char)((ushort)(*puVar4 + 2) >> 8);
    iVar3 = (*fp->_vptr_CVmDataSource[4])(fp,buf,2);
    if (iVar3 != 0) goto LAB_0027616c;
    uStack_50 = (ulong)*puVar4;
    pp_Var5 = fp->_vptr_CVmDataSource;
    puVar4 = puVar4 + 1;
    break;
  default:
    if (val->typ != VM_ENUM) goto switchD_002760de_caseD_3;
    buf[0] = ' ';
LAB_00276155:
    buf._1_4_ = (val->val).obj;
    pp_Var5 = fp->_vptr_CVmDataSource;
    uStack_50 = 5;
    puVar4 = (ushort *)buf;
  }
  iVar3 = (*pp_Var5[4])(fp,puVar4,uStack_50);
LAB_00276168:
  if (iVar3 == 0) {
    return;
  }
LAB_0027616c:
  CVmRun::throw_new_class(&G_interpreter_X,G_predef_X.file_io_exc,0,"file I/O error");
}

Assistant:

void CVmObjFile::write_data_mode(VMG_ const vm_val_t *val)
{
    char buf[32];
    CVmDataSource *fp = get_ext()->fp;
    vm_val_t new_str;
    const char *constp;

    /* see what type of data we want to put */
    switch(val->typ)
    {
    case VM_INT:
        /* put the type in the buffer */
        buf[0] = VMOBJFILE_TAG_INT;
        
        /* add the value in INT4 format */
        oswp4s(buf + 1, val->val.intval);
        
        /* write out the type prefix plus the value */
        if (fp->write(buf, 5))
            goto io_error;

        /* done */
        break;

    case VM_ENUM:
        /* put the type in the buffer */
        buf[0] = VMOBJFILE_TAG_ENUM;

        /* add the value in INT4 format */
        oswp4(buf + 1, val->val.enumval);

        /* write out the type prefix plus the value */
        if (fp->write(buf, 5))
            goto io_error;

        /* done */
        break;

    case VM_SSTRING:
        /* get the string value pointer */
        constp = val->get_as_string(vmg0_);

    write_binary_string:
        /* write the type prefix byte */
        buf[0] = VMOBJFILE_TAG_STRING;
        if (fp->write(buf, 1))
            goto io_error;

        /* 
         *   write the length prefix - for TADS 2 compatibility, include
         *   the bytes of the prefix itself in the length count 
         */
        oswp2(buf, vmb_get_len(constp) + 2);
        if (fp->write(buf, 2))
            goto io_error;

        /* write the string's bytes */
        if (fp->write(constp + VMB_LEN, vmb_get_len(constp)))
            goto io_error;

        /* done */
        break;

    case VM_OBJ:
        /*
         *   Write BigNumber and ByteArray types in special formats.  For
         *   other types, try converting to a string. 
         */
        if (CVmObjBigNum::is_bignum_obj(vmg_ val->val.obj))
        {
            CVmObjBigNum *bignum;
            
            /* we know it's a BigNumber - cast it properly */
            bignum = (CVmObjBigNum *)vm_objp(vmg_ val->val.obj);

            /* write the type tag */
            buf[0] = VMOBJFILE_TAG_BIGNUM;
            if (fp->write(buf, 1))
                goto io_error;

            /* write it out */
            if (bignum->write_to_data_file(fp))
                goto io_error;
        }
        else if (CVmObjByteArray::is_byte_array(vmg_ val->val.obj))
        {
            CVmObjByteArray *bytarr;

            /* we know it's a ByteArray - cast it properly */
            bytarr = (CVmObjByteArray *)vm_objp(vmg_ val->val.obj);

            /* write the type tag */
            buf[0] = VMOBJFILE_TAG_BYTEARRAY;
            if (fp->write(buf, 1))
                goto io_error;
            
            /* write the array */
            if (bytarr->write_to_data_file(fp))
                goto io_error;
        }
        else
        {
            /* 
             *   Cast it to a string value and write that out.  Note that
             *   we can ignore garbage collection for any new string we've
             *   created, since we're just calling the OS-level file
             *   writer, which will never invoke garbage collection.  
             */
            constp = vm_objp(vmg_ val->val.obj)
                     ->cast_to_string(vmg_ val->val.obj, &new_str);
            goto write_binary_string;
        }